

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

bool mjs::anon_unknown_2::is_identifier_part_v5(int ch)

{
  classification cVar1;
  bool local_12;
  bool local_9;
  int ch_local;
  
  cVar1 = classify(ch);
  if (cVar1 == format) {
    local_12 = ch == 0x200c || ch == 0x200d;
    local_9 = local_12;
  }
  else if ((byte)(cVar1 - id_part) < 2) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

constexpr bool is_identifier_part_v5(int ch) {
    switch (classify(ch)) {
    case unicode::classification::id_start:
    case unicode::classification::id_part:
        return true;
    case unicode::classification::format:
        // ES5.1, \u200c (<ZWNJ>) and \u200d (<ZWJ>) are considered identifier parts outside literals/comments/etc.
        return ch == unicode_ZWNJ || ch == unicode_ZWJ;
    default:
        return false;
    }
}